

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O1

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::printUserSettings(SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    *this)

{
  double dVar1;
  ostream *poVar2;
  long lVar3;
  char cVar4;
  ulong uVar5;
  char *pcVar6;
  long *plVar7;
  bool bVar8;
  long lVar9;
  long *local_90;
  long local_88;
  long local_80 [2];
  long *local_70;
  long local_68;
  long local_60 [2];
  long *local_50;
  long local_48;
  long local_40 [2];
  
  poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
  lVar9 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar9 + -0x18) + 8) = 8;
  lVar9 = *(long *)(lVar9 + -0x18);
  *(uint *)(poVar2 + lVar9 + 0x18) = *(uint *)(poVar2 + lVar9 + 0x18) & 0xfffffefb | 4;
  plVar7 = &DAT_006bb030;
  lVar9 = 0;
  bVar8 = false;
  do {
    if (this->_currentSettings->_boolParamValues[lVar9] != (bool)(&DAT_006bb6a8)[lVar9]) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],"bool:",5);
      local_50 = local_40;
      std::__cxx11::string::_M_construct<char*>((string *)&local_50,plVar7[-1],*plVar7 + plVar7[-1])
      ;
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],(char *)local_50,local_48);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity]," = ",3);
      uVar5 = (ulong)this->_currentSettings->_boolParamValues[lVar9];
      pcVar6 = "false\n";
      if (uVar5 != 0) {
        pcVar6 = "true\n";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],pcVar6,6 - uVar5);
      bVar8 = true;
      if (local_50 != local_40) {
        operator_delete(local_50,local_40[0] + 1);
      }
    }
    lVar9 = lVar9 + 1;
    plVar7 = plVar7 + 4;
  } while (lVar9 != 0x1a);
  lVar9 = 0;
  do {
    if (*(int *)((long)this->_currentSettings->_intParamValues + lVar9) !=
        *(int *)((long)&DAT_006bbdd0 + lVar9)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],"int:",4);
      local_70 = local_60;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,
                 (&SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   ::Settings::intParam)[lVar9],
                 (&DAT_006bb6d8)[lVar9] +
                 (&SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                   ::Settings::intParam)[lVar9]);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],(char *)local_70,local_68);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity]," = ",3);
      std::ostream::operator<<
                ((ostream *)(this->spxout).m_streams[(this->spxout).m_verbosity],
                 *(int *)((long)this->_currentSettings->_intParamValues + lVar9));
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
      bVar8 = true;
      if (local_70 != local_60) {
        operator_delete(local_70,local_60[0] + 1);
      }
    }
    lVar9 = lVar9 + 4;
  } while (lVar9 != 0x70);
  poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
  lVar9 = *(long *)poVar2;
  *(undefined8 *)(poVar2 + *(long *)(lVar9 + -0x18) + 8) = 8;
  lVar9 = *(long *)(lVar9 + -0x18);
  *(uint *)(poVar2 + lVar9 + 0x18) = *(uint *)(poVar2 + lVar9 + 0x18) & 0xfffffefb | 0x100;
  lVar9 = 0;
  do {
    dVar1 = *(double *)((long)this->_currentSettings->_realParamValues + lVar9);
    if ((dVar1 != *(double *)((long)&DAT_006bc5e8 + lVar9)) ||
       (NAN(dVar1) || NAN(*(double *)((long)&DAT_006bc5e8 + lVar9)))) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],"real:",5);
      lVar3 = *(long *)((long)&SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                               ::Settings::realParam + lVar9 * 4);
      local_90 = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_90,lVar3,*(long *)((long)&DAT_006bbf30 + lVar9 * 4) + lVar3);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],(char *)local_90,local_88);
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity]," = ",3);
      std::ostream::_M_insert<double>
                (*(double *)((long)this->_currentSettings->_realParamValues + lVar9));
      std::__ostream_insert<char,std::char_traits<char>>
                ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
      bVar8 = true;
      if (local_90 != local_80) {
        operator_delete(local_90,local_80[0] + 1);
      }
    }
    lVar9 = lVar9 + 8;
  } while (lVar9 != 0xd8);
  if ((this->_solver).random.seedshift != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],"uint:random_seed = ",0x13);
    std::ostream::_M_insert<unsigned_long>
              ((ulong)(this->spxout).m_streams[(this->spxout).m_verbosity]);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],"\n",1);
    bVar8 = true;
  }
  if (bVar8) {
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar4 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
  }
  return;
}

Assistant:

void SoPlexBase<R>::printUserSettings()
{
   bool printedValue = false;

   SPxOut::setFixed(spxout.getCurrentStream());

   for(int i = 0; i < SoPlexBase<R>::BOOLPARAM_COUNT; i++)
   {
      if(_currentSettings->_boolParamValues[i] == _currentSettings->boolParam.defaultValue[i])
         continue;

      spxout << "bool:" << _currentSettings->boolParam.name[i] << " = " <<
             (_currentSettings->_boolParamValues[i] ? "true\n" : "false\n");
      printedValue = true;
   }

   for(int i = 0; i < SoPlexBase<R>::INTPARAM_COUNT; i++)
   {
      if(_currentSettings->_intParamValues[i] == _currentSettings->intParam.defaultValue[i])
         continue;

      spxout << "int:" << _currentSettings->intParam.name[i] << " = " <<
             _currentSettings->_intParamValues[i] << "\n";
      printedValue = true;
   }

   SPxOut::setScientific(spxout.getCurrentStream());

   for(int i = 0; i < SoPlexBase<R>::REALPARAM_COUNT; i++)
   {
      if(_currentSettings->_realParamValues[i] == _currentSettings->realParam.defaultValue[i])
         continue;

      spxout << "real:" << _currentSettings->realParam.name[i] << " = " <<
             _currentSettings->_realParamValues[i] << "\n";
      printedValue = true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   for(int i = 0; i < SoPlexBase<R>::RATIONALPARAM_COUNT; i++)
   {
      if(_currentSettings->_rationalParamValues[i] == _currentSettings->rationalParam.defaultValue[i])
         continue;

      spxout << "rational:" << _currentSettings->rationalParam.name[i] << " = " <<
             _currentSettings->_rationalParamValues[i] << "\n";
      printedValue = true;
   }

#endif

   if(_solver.random.getSeed() != SOPLEX_DEFAULT_RANDOM_SEED)
   {
      spxout << "uint:random_seed = " << _solver.random.getSeed() << "\n";
      printedValue = true;
   }

   if(printedValue)
      spxout << std::endl;
}